

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tools.cpp
# Opt level: O2

size_t Tools::leaf_index_nothrow(bitset_t *split)

{
  size_type sVar1;
  size_type sVar2;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> dStack_38;
  
  sVar2 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::count(split);
  sVar1 = split->m_num_bits;
  if (sVar2 == sVar1 - 1) {
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator~
              (&dStack_38,split);
    sVar2 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::find_first
                      (&dStack_38);
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
              (&dStack_38);
  }
  else {
    sVar2 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::find_first(split);
  }
  return sVar1 + ~sVar2;
}

Assistant:

size_t Tools::leaf_index_nothrow(const bitset_t split) {
    if (split.count() == split.size() - 1) {
        return split.size() - (~split).find_first() - 1;
    } else {
        return split.size() - split.find_first() - 1;
    }
}